

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O1

void V_SetRndCmp(Vector *V)

{
  Real *pRVar1;
  LASErrIdType LVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  
  LVar2 = LASResult();
  if (LVar2 == LASOK) {
    LVar2 = LASResult();
    if (LVar2 == LASOK) {
      sVar5 = V->Dim;
    }
    else {
      sVar5 = 0;
    }
    if (sVar5 != 0) {
      pRVar1 = V->Cmp;
      uVar4 = 1;
      do {
        iVar3 = rand();
        pRVar1[uVar4] = (double)iVar3 * 4.656612873077393e-10;
        uVar4 = uVar4 + 1;
      } while (uVar4 <= sVar5);
    }
    V->Multipl = 1.0;
  }
  return;
}

Assistant:

void V_SetRndCmp(Vector *V)
/* set random components of the vector V */
{
    size_t Dim, Ind;
    Real *VCmp;

    if (LASResult() == LASOK) {
        Dim = V_GetDim(V);
        VCmp = V->Cmp;
        for (Ind = 1; Ind <= Dim; Ind++) {
            VCmp[Ind] = (double)rand() / ((double)RAND_MAX + 1.0);
        }
        V->Multipl = 1.0;
    }
}